

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O3

void __thiscall clunk::Node::GetPawnMoves<false,true>(Node *this,int from,int depth)

{
  uint32_t uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  Move *pMVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x617,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  uVar14 = (ulong)(uint)from;
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x618,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  pcVar3 = (char *)(&_board)[uVar14];
  if (pcVar3 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x619,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  if (*pcVar3 != '\x02') {
    __assert_fail("_board[from]->type == (color|Pawn)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61a,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  if ((uint)(byte)pcVar3[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x61b,
                  "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                 );
  }
  uVar4 = GetPinDir(this,false,from);
  uVar11 = 0;
  if (depth == 0) {
    uVar5 = GetDiscoverDir(this,false,from);
    uVar11 = uVar5 + 0x10 & 0xffffffdf;
    if (uVar11 != 0) {
      uVar11 = uVar5;
    }
  }
  if (*(ulong *)(_pawnCaps + uVar14 * 8) != 0) {
    uVar13 = *(ulong *)(_pawnCaps + uVar14 * 8);
    do {
      if ((uVar13 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x629,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                     );
      }
      iVar7 = (int)(uVar13 & 0xff);
      uVar5 = iVar7 - 1;
      if ((uVar5 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100,"int clunk::Distance(const int, const int)");
      }
      if ((&_dist)[(ulong)uVar5 + uVar14 * 0x80] != '\x01') {
        __assert_fail("Distance(from, to) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62b,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                     );
      }
      bVar6 = (&_dir)[(ulong)uVar5 + uVar14 * 0x80];
      if (((0x11 < bVar6) || ((0x38002U >> (bVar6 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar6 - 0xef || ((0x10007U >> (bVar6 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(Direction(from, to))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x62c,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                     );
      }
      if ((uVar4 == 0) || (uVar4 == (byte)((bVar6 ^ (char)bVar6 >> 7) - ((char)bVar6 >> 7)))) {
        bVar6 = *(byte *)(&_board)[uVar5];
        if ((bVar6 == 0) && ((byte *)(&_board)[uVar5] != _EMPTY)) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x631,
                        "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                       );
        }
        uVar12 = (uint)bVar6;
        if (uVar12 == 0) {
          if (((this->ep != 0x78) && (uVar5 == this->ep)) &&
             (bVar15 = EpPinned<false>(from,iVar7 + -0x11), !bVar15)) {
            uVar12 = this->moveCount;
            lVar8 = (long)(int)uVar12;
            if (lVar8 < 0) goto LAB_0012efd8;
            if (0x7e < uVar12) goto LAB_0012eff7;
            this->moveCount = uVar12 + 1;
            iVar7 = 100;
            uVar12 = 0;
LAB_0012eb00:
            iVar9 = 0;
LAB_0012eb03:
            pMVar10 = this->moves + lVar8;
            Move::Set(pMVar10,PawnCap,from,uVar5,uVar12,iVar9,iVar7);
            iVar7 = 0;
            if (pMVar10->bits == this->killer[1].bits) {
              iVar7 = 0x32;
            }
            if (pMVar10->bits == this->killer[0].bits) {
              iVar7 = 0x32;
            }
            Move::IncScore(pMVar10,iVar7);
          }
        }
        else if ((bVar6 & 1) != 0) {
          if (9 < bVar6 - 2) {
            __assert_fail("!pc || IS_CAP(pc)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x114,"int clunk::ValueOf(const int)");
          }
          iVar7 = *(int *)(_VALUE_OF + (ulong)uVar12 * 4);
          if ((~uVar5 & 0x70) != 0) {
            uVar2 = this->moveCount;
            lVar8 = (long)(int)uVar2;
            if (-1 < lVar8) {
              if (uVar2 < 0x7f) {
                this->moveCount = uVar2 + 1;
                goto LAB_0012eb00;
              }
              goto LAB_0012eff7;
            }
            goto LAB_0012efd8;
          }
          uVar12 = this->moveCount;
          lVar8 = (long)(int)uVar12;
          if (lVar8 < 0) goto LAB_0012efd8;
          if (0x7e < uVar12) goto LAB_0012eff7;
          this->moveCount = uVar12 + 1;
          uVar12 = (uint)bVar6;
          Move::Set(this->moves + lVar8,PawnCap,from,uVar5,(uint)bVar6,10,iVar7 + 0x3cf);
          uVar1 = this->moves[lVar8].bits;
          iVar9 = 0;
          if (uVar1 == this->killer[1].bits) {
            iVar9 = 0x32;
          }
          if (uVar1 == this->killer[0].bits) {
            iVar9 = 0x32;
          }
          Move::IncScore(this->moves + lVar8,iVar9);
          if (depth == 0) {
            uVar2 = this->moveCount;
            lVar8 = (long)(int)uVar2;
            if (-1 < lVar8) {
              if (uVar2 < 0x7f) {
                this->moveCount = uVar2 + 1;
                Move::Set(this->moves + lVar8,PawnCap,from,uVar5,uVar12,8,iVar7 + 500);
                uVar1 = this->moves[lVar8].bits;
                iVar9 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar9 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar9 = 0x32;
                }
                Move::IncScore(this->moves + lVar8,iVar9);
                uVar2 = this->moveCount;
                lVar8 = (long)(int)uVar2;
                if (-1 < lVar8) {
                  if (uVar2 < 0x7f) {
                    this->moveCount = uVar2 + 1;
                    Move::Set(this->moves + lVar8,PawnCap,from,uVar5,uVar12,6,iVar7 + 0x140);
                    uVar1 = this->moves[lVar8].bits;
                    iVar9 = 0;
                    if (uVar1 == this->killer[1].bits) {
                      iVar9 = 0x32;
                    }
                    if (uVar1 == this->killer[0].bits) {
                      iVar9 = 0x32;
                    }
                    Move::IncScore(this->moves + lVar8,iVar9);
                    uVar2 = this->moveCount;
                    lVar8 = (long)(int)uVar2;
                    if (-1 < lVar8) {
                      if (uVar2 < 0x7f) {
                        iVar7 = iVar7 + 300;
                        this->moveCount = uVar2 + 1;
                        iVar9 = 4;
                        goto LAB_0012eb03;
                      }
                      goto LAB_0012eff7;
                    }
                    goto LAB_0012efd8;
                  }
                  goto LAB_0012eff7;
                }
                goto LAB_0012efd8;
              }
              goto LAB_0012eff7;
            }
            goto LAB_0012efd8;
          }
        }
      }
      bVar15 = 0xff < uVar13;
      uVar13 = uVar13 >> 8;
    } while (bVar15);
  }
  if ((uint)from >> 4 == 6 || depth == 0) {
    uVar5 = from + 0x10;
    if (uVar4 != 0) {
      if (0x6f < (uint)from) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      bVar6 = (char)(&_dir)[(ulong)uVar5 + uVar14 * 0x80] >> 7;
      if (uVar4 != (byte)(((&_dir)[(ulong)uVar5 + uVar14 * 0x80] ^ bVar6) - bVar6)) {
        return;
      }
    }
    if ((undefined *)(&_board)[uVar5] == _EMPTY) {
      if ((uVar5 & 0xf0) == 0x70) {
        uVar11 = this->moveCount;
        if (-1 < (long)(int)uVar11) {
          if (uVar11 < 0x7f) {
            this->moveCount = uVar11 + 1;
            pMVar10 = this->moves + (int)uVar11;
            Move::Set(pMVar10,PawnMove,from,uVar5,0,10,0x3cf);
            iVar7 = 0;
            if (pMVar10->bits == this->killer[1].bits) {
              iVar7 = 0x32;
            }
            if (pMVar10->bits == this->killer[0].bits) {
              iVar7 = 0x32;
            }
            Move::IncScore(pMVar10,iVar7);
            if (depth != 0) {
              return;
            }
            uVar11 = this->moveCount;
            lVar8 = (long)(int)uVar11;
            if (lVar8 < 0) goto LAB_0012efd8;
            if (uVar11 < 0x7f) {
              this->moveCount = uVar11 + 1;
              Move::Set(this->moves + lVar8,PawnMove,from,uVar5,0,8,500);
              uVar1 = this->moves[lVar8].bits;
              iVar7 = 0;
              if (uVar1 == this->killer[1].bits) {
                iVar7 = 0x32;
              }
              if (uVar1 == this->killer[0].bits) {
                iVar7 = 0x32;
              }
              Move::IncScore(this->moves + lVar8,iVar7);
              uVar11 = this->moveCount;
              lVar8 = (long)(int)uVar11;
              if (lVar8 < 0) goto LAB_0012efd8;
              if (uVar11 < 0x7f) {
                this->moveCount = uVar11 + 1;
                Move::Set(this->moves + lVar8,PawnMove,from,uVar5,0,6,0x140);
                uVar1 = this->moves[lVar8].bits;
                iVar7 = 0;
                if (uVar1 == this->killer[1].bits) {
                  iVar7 = 0x32;
                }
                if (uVar1 == this->killer[0].bits) {
                  iVar7 = 0x32;
                }
                Move::IncScore(this->moves + lVar8,iVar7);
                uVar11 = this->moveCount;
                lVar8 = (long)(int)uVar11;
                if (lVar8 < 0) goto LAB_0012efd8;
                if (uVar11 < 0x7f) {
                  this->moveCount = uVar11 + 1;
                  Move::Set(this->moves + lVar8,PawnMove,from,uVar5,0,4,300);
                  uVar1 = this->moves[lVar8].bits;
                  iVar7 = 0;
                  if (uVar1 == this->killer[1].bits) {
                    iVar7 = 0x32;
                  }
                  if (uVar1 == this->killer[0].bits) {
                    iVar7 = 0x32;
                  }
                  Move::IncScore(this->moves + lVar8,iVar7);
                  return;
                }
              }
            }
          }
LAB_0012eff7:
          __assert_fail("(moveCount + 1) < MaxMoves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x60e,
                        "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                       );
        }
LAB_0012efd8:
        __assert_fail("moveCount >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x60d,
                      "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                     );
      }
      if (depth != 0) {
        __assert_fail("!depth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x658,
                      "void clunk::Node::GetPawnMoves(const int, const int) [color = false, qsearch = true]"
                     );
      }
      if ((from + 0x21U == (uint)(byte)PTR_DAT_0015c338[1] ||
          from + 0x1fU == (uint)(byte)PTR_DAT_0015c338[1]) || uVar11 != 0) {
        uVar4 = this->moveCount;
        if ((long)(int)uVar4 < 0) goto LAB_0012efd8;
        if (0x7e < uVar4) goto LAB_0012eff7;
        iVar7 = *(int *)(_PAWN_SQR + (ulong)uVar5 * 4);
        iVar9 = *(int *)(_PAWN_SQR + uVar14 * 4);
        this->moveCount = uVar4 + 1;
        pMVar10 = this->moves + (int)uVar4;
        Move::Set(pMVar10,PawnMove,from,uVar5,0,0,(iVar7 - iVar9) + 0x19);
        iVar7 = 0;
        if (pMVar10->bits == this->killer[1].bits) {
          iVar7 = 0x32;
        }
        if (pMVar10->bits == this->killer[0].bits) {
          iVar7 = 0x32;
        }
        Move::IncScore(pMVar10,iVar7);
      }
      if ((uint)from >> 4 == 1) {
        uVar4 = from | 0x20;
        if (((undefined *)(&_board)[uVar4] == _EMPTY) &&
           (uVar11 != 0 ||
            (from + 0x31U == (uint)(byte)PTR_DAT_0015c338[1] ||
            from + 0x2fU == (uint)(byte)PTR_DAT_0015c338[1]))) {
          AddMove(this,PawnLung,from,uVar4,
                  (*(int *)(_PAWN_SQR + (ulong)uVar4 * 4) - *(int *)(_PAWN_SQR + uVar14 * 4)) + 0x1e
                  ,0,0);
        }
      }
    }
  }
  return;
}

Assistant:

void GetPawnMoves(const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Pawn));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    int to;

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
      if (abs(kdir) == North) {
        kdir = 0;
      }
    }

    for (uint64_t mvs = _pawnCaps[from + (color * 8)]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        continue;
      }
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if ((ep != None) && (to == ep) &&
            !EpPinned<color>(from, (ep + (color ? North : South))))
        {
          AddMove(PawnCap, from, to, PawnValue);
        }
      }
      else if (COLOR(cap) != color) {
        score = ValueOf(cap);
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnCap, from, to, (score + QueenValue),  cap, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnCap, from, to, (score + RookValue),   cap, (color|Rook));
            AddMove(PawnCap, from, to, (score + BishopValue), cap, (color|Bishop));
            AddMove(PawnCap, from, to, (score + KnightValue), cap, (color|Knight));
          }
        }
        else {
          AddMove(PawnCap, from, to, score, cap);
        }
      }
    }
    if (!qsearch || ((!depth) | (YC(from) == (color ? 1 : 6)))) {
      to = (from + (color ? South : North));
      if (pinDir && (abs(Direction(from, to)) != pinDir)) {
        return;
      }
      if (_board[to] == _EMPTY) {
        if (YC(to) == (color ? 0 : 7)) {
          AddMove(PawnMove, from, to, QueenValue,  0, (color|Queen));
          if (!qsearch || !depth) {
            AddMove(PawnMove, from, to, RookValue,   0, (color|Rook));
            AddMove(PawnMove, from, to, BishopValue, 0, (color|Bishop));
            AddMove(PawnMove, from, to, KnightValue, 0, (color|Knight));
          }
        }
        else {
          if (qsearch) {
            assert(!depth);
            if (kdir |
                ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
            {
              score = (_PAWN_SQR[to + (8 * color)] -
                       _PAWN_SQR[from + (8 * color)] + 25);
              AddMove(PawnMove, from, to, score);
            }
          }
          else {
            score = (_PAWN_SQR[to + (8 * color)] -
                     _PAWN_SQR[from + (8 * color)] + 5);
            AddMove(PawnMove, from, to, score);
          }
          if (YC(from) == (color ? 6 : 1)) {
            to += (color ? South : North);
            assert(IS_SQUARE(to));
            if (_board[to] == _EMPTY) {
              if (qsearch) {
                assert(!depth);
                if (kdir |
                    ((to + (color ? SouthWest : NorthWest)) == _KING[!color]->sqr) |
                    ((to + (color ? SouthEast : NorthEast)) == _KING[!color]->sqr))
                {
                  score = (_PAWN_SQR[to + (8 * color)] -
                           _PAWN_SQR[from + (8 * color)] + 30);
                  AddMove(PawnLung, from, to, score);
                }
              }
              else {
                score = (_PAWN_SQR[to + (8 * color)] -
                         _PAWN_SQR[from + (8 * color)] + 10);
                AddMove(PawnLung, from, to, score);
              }
            }
          }
        }
      }
    }
  }